

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O1

SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
::operator=(SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
            *this,CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *_rhs)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  ulong uVar4;
  PointerType pdVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  Index index_1;
  long lVar9;
  Index index;
  ulong uVar10;
  ulong uVar11;
  
  uVar4 = (this->m_matrix->
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_0>
          .m_rows.m_value;
  if (uVar4 != *(ulong *)&(_rhs->m_xpr).field_0x8) {
    __assert_fail("rows() == rhs.rows() && cols() == rhs.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/SelfCwiseBinaryOp.h"
                  ,0x88,
                  "SelfCwiseBinaryOp<BinOp, Lhs, Rhs> &Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Map<Eigen::Matrix<double, -1, 1>>>>::lazyAssign(const DenseBase<RhsDerived> &) [BinOp = Eigen::internal::scalar_difference_op<double>, Lhs = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, Rhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Map<Eigen::Matrix<double, -1, 1>>>, RhsDerived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Map<Eigen::Matrix<double, -1, 1>>>]"
                 );
  }
  pdVar5 = (this->m_matrix->
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_0>
           .m_data;
  uVar10 = (ulong)((uint)((ulong)pdVar5 >> 3) & 1);
  if ((long)uVar4 <= (long)uVar10) {
    uVar10 = uVar4;
  }
  lVar6 = *(long *)&_rhs->m_xpr;
  if (((ulong)pdVar5 & 7) != 0) {
    uVar10 = uVar4;
  }
  dVar3 = (_rhs->m_functor).m_other;
  lVar9 = uVar4 - uVar10;
  if (0 < (long)uVar10) {
    uVar11 = 0;
    do {
      pdVar5[uVar11] = pdVar5[uVar11] - *(double *)(lVar6 + uVar11 * 8) * dVar3;
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  uVar11 = (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU) + uVar10;
  if (1 < lVar9) {
    do {
      pdVar5 = (this->m_matrix->
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_0>
               .m_data;
      pdVar1 = pdVar5 + uVar10;
      dVar7 = pdVar1[1];
      pdVar2 = (double *)(lVar6 + uVar10 * 8);
      dVar8 = pdVar2[1];
      pdVar5 = pdVar5 + uVar10;
      *pdVar5 = *pdVar1 - *pdVar2 * dVar3;
      pdVar5[1] = dVar7 - dVar8 * dVar3;
      uVar10 = uVar10 + 2;
    } while ((long)uVar10 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar4) {
    pdVar5 = (this->m_matrix->
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
             ).
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_0>
             .m_data;
    do {
      pdVar5[uVar11] = pdVar5[uVar11] - *(double *)(lVar6 + uVar11 * 8) * dVar3;
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
  }
  return this;
}

Assistant:

SelfCwiseBinaryOp& operator=(const Rhs& _rhs)
    {
      typename internal::nested<Rhs>::type rhs(_rhs);
      return Base::operator=(rhs);
    }